

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O0

void __thiscall
amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit
          (GpuBndryFuncFab<PeleLMCCFillExtDir> *this,Box *bx,FArrayBox *dest,int dcomp,int numcomp,
          Geometry *geom,Real time,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int bcomp,int orig_comp)

{
  undefined8 uVar1;
  long lVar2;
  undefined8 uVar3;
  IndexType IVar4;
  bool bVar5;
  Box *pBVar6;
  undefined4 in_ECX;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long in_RDX;
  uint i;
  int iVar10;
  Box *in_RSI;
  Geometry *in_RDI;
  undefined4 in_R8D;
  Geometry *in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  IntVect IVar11;
  undefined4 in_stack_00000018;
  int dzhi;
  Box bndry_5;
  int dzlo;
  Box bndry_4;
  int dyhi;
  Box bndry_3;
  int dylo;
  Box bndry_2;
  int dxhi;
  Box bndry_1;
  int dxlo;
  Box bndry;
  PeleLMCCFillExtDir f_user;
  BCRec *bcr_p;
  AsyncArray<amrex::BCRec,_0> bcr_aa;
  GeometryData geomdata;
  Array4<double> *fab;
  int idim;
  Box gdomain;
  Box bx_1;
  Box *domain;
  IntVect *len;
  IntVect shft;
  undefined4 in_stack_fffffffffffff510;
  undefined4 in_stack_fffffffffffff514;
  undefined4 in_stack_fffffffffffff518;
  undefined4 in_stack_fffffffffffff51c;
  undefined1 auStack_ab8 [16];
  anon_class_256_9_e3cd3141 *in_stack_fffffffffffff558;
  Box *in_stack_fffffffffffff560;
  undefined1 auStack_a50 [120];
  undefined8 local_9d8;
  BCRec *local_9d0;
  undefined4 local_9c8;
  int local_9c0;
  Box local_9bc;
  undefined4 local_9a0;
  undefined4 local_99c;
  undefined1 auStack_998 [64];
  int local_958;
  undefined8 local_950;
  Real local_948;
  Real local_940;
  undefined4 local_938;
  undefined1 auStack_930 [120];
  undefined8 local_8b8;
  BCRec *local_8b0;
  undefined4 local_8a8;
  int local_8a0;
  Box local_89c;
  undefined4 local_880;
  undefined4 local_87c;
  undefined1 auStack_878 [64];
  int local_838;
  undefined8 local_830;
  Real local_828;
  Real local_820;
  undefined4 local_818;
  undefined1 auStack_810 [120];
  undefined8 local_798;
  BCRec *local_790;
  undefined4 local_788;
  int local_780;
  Box local_77c;
  undefined4 local_760;
  undefined4 local_75c;
  undefined1 auStack_758 [64];
  int local_718;
  undefined8 local_710;
  Real local_708;
  Real local_700;
  undefined4 local_6f8;
  undefined1 auStack_6f0 [120];
  undefined8 local_678;
  BCRec *local_670;
  undefined4 local_668;
  int local_660;
  Box local_65c;
  undefined4 local_640;
  undefined4 local_63c;
  undefined1 auStack_638 [64];
  int local_5f8;
  undefined8 local_5f0;
  Real local_5e8;
  Real local_5e0;
  undefined4 local_5d8;
  undefined1 auStack_5d0 [120];
  undefined8 local_558;
  BCRec *local_550;
  undefined4 local_548;
  int local_540;
  Box local_53c;
  undefined4 local_520;
  undefined4 local_51c;
  undefined1 auStack_518 [64];
  int local_4d8;
  undefined8 local_4d0;
  Real local_4c8;
  Real local_4c0;
  undefined4 local_4b8;
  undefined1 auStack_4b0 [120];
  undefined8 local_438;
  BCRec *local_430;
  undefined4 local_428;
  int local_420;
  Box local_41c;
  undefined8 local_400;
  Real local_3f8;
  Real local_3f0;
  Real local_3e8;
  BCRec *local_3e0;
  AsyncArray<amrex::BCRec,_0> local_3d8;
  undefined1 local_3c8 [120];
  Array4<double> local_350;
  Array4<double> *local_310;
  int local_308;
  Box local_304;
  int local_2e8 [2];
  int local_2e0;
  IntVect local_2d8;
  Box local_2c8;
  Box *local_2a0;
  int local_298 [3];
  undefined8 local_288;
  int local_280;
  undefined8 *local_278;
  undefined8 local_270;
  Geometry *local_268;
  undefined4 local_260;
  undefined4 local_25c;
  long local_258;
  Box *local_250;
  int local_23c;
  undefined8 *local_238;
  long local_230;
  Dim3 local_228;
  Dim3 local_214;
  Dim3 local_208;
  Dim3 local_1f8;
  int local_1ec;
  undefined8 *local_1e8;
  double *local_1e0;
  Dim3 local_1d8;
  undefined8 *local_1c8;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  int local_1b8;
  undefined4 local_1b4;
  undefined8 *local_1b0;
  undefined4 local_1a4;
  undefined8 *local_1a0;
  undefined4 local_194;
  undefined8 *local_190;
  Dim3 local_188;
  undefined8 *local_178;
  int local_170;
  int iStack_16c;
  int local_168;
  undefined4 local_164;
  long local_160;
  undefined4 local_154;
  long local_150;
  undefined4 local_144;
  int *local_140;
  IntVect *local_138;
  Box *local_130;
  int local_128 [2];
  int local_120;
  IntVect local_118;
  IndexType local_10c;
  int local_108 [2];
  int local_100;
  int local_f8 [2];
  int local_f0;
  int local_e8;
  int iStack_e4;
  int local_e0;
  int local_dc;
  int iStack_d8;
  int local_d4;
  IntVect *local_d0;
  Box *local_c8;
  int *local_c0;
  IntVect *local_b8;
  undefined4 local_ac;
  int *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  int *local_88;
  int local_80 [2];
  int local_78;
  IndexType *local_70;
  IntVect local_64;
  int local_58 [2];
  int local_50;
  int *local_48;
  IntVect *local_40;
  IntVect local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_270 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_268 = in_R9;
  local_260 = in_R8D;
  local_25c = in_ECX;
  local_258 = in_RDX;
  local_250 = in_RSI;
  IVar11 = Box::length((Box *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  local_298[2] = IVar11.vect[2];
  local_280 = local_298[2];
  local_298._0_8_ = IVar11.vect._0_8_;
  local_288._0_4_ = local_298[0];
  local_288._4_4_ = local_298[1];
  local_278 = &local_288;
  local_298 = IVar11.vect;
  pBVar6 = Geometry::Domain(local_268);
  IntVect::IntVect(&local_118,1);
  local_120 = local_118.vect[2];
  local_128[0] = local_118.vect[0];
  local_128[1] = local_118.vect[1];
  local_2e0 = local_118.vect[2];
  local_2e8[0] = local_118.vect[0];
  local_2e8[1] = local_118.vect[1];
  local_2d8.vect[2] = local_118.vect[2];
  local_2d8.vect[0] = local_118.vect[0];
  local_2d8.vect[1] = local_118.vect[1];
  local_2c8.smallend.vect._0_8_ = *(undefined8 *)(pBVar6->smallend).vect;
  uVar1 = *(undefined8 *)((pBVar6->smallend).vect + 2);
  lVar2 = *(long *)((pBVar6->bigend).vect + 2);
  local_2c8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pBVar6->bigend).vect >> 0x20);
  local_2c8.btype.itype = (uint)((ulong)lVar2 >> 0x20);
  local_2c8.smallend.vect[2] = (int)uVar1;
  local_2c8.bigend.vect[0] = (int)((ulong)uVar1 >> 0x20);
  local_c8 = &local_2c8;
  local_70 = &local_2c8.btype;
  i = local_2c8.btype.itype & 1;
  uVar8 = local_2c8.btype.itype >> 1;
  uVar7 = local_2c8.btype.itype >> 2;
  IVar4.itype = local_2c8.btype.itype;
  local_2c8._20_8_ = lVar2;
  local_138 = &local_2d8;
  local_130 = pBVar6;
  local_d0 = &local_2d8;
  lVar2 = local_2c8._20_8_;
  local_2c8.btype.itype = IVar4.itype;
  IntVect::IntVect(&local_64,i,uVar8 & 1,uVar7 & 1);
  uVar1 = local_2c8._20_8_;
  local_78 = local_64.vect[2];
  local_80[0] = local_64.vect[0];
  local_80[1] = local_64.vect[1];
  local_f0 = local_64.vect[2];
  local_f8[0] = local_64.vect[0];
  local_f8[1] = local_64.vect[1];
  local_e0 = local_64.vect[2];
  local_e8 = local_64.vect[0];
  iStack_e4 = local_64.vect[1];
  uVar3 = _local_e8;
  local_48 = &local_e8;
  local_c = 0;
  local_e8 = local_64.vect[0];
  iVar10 = local_2d8.vect[0] - local_e8;
  local_1c = 1;
  iStack_e4 = local_64.vect[1];
  iVar9 = local_2d8.vect[1] - iStack_e4;
  local_2c = 2;
  IVar4.itype = local_2c8.btype.itype;
  local_2c8._20_8_ = uVar1;
  _local_e8 = uVar3;
  local_40 = &local_2d8;
  local_28 = local_48;
  local_18 = local_48;
  local_8 = local_48;
  uVar1 = local_2c8._20_8_;
  local_2c8.btype.itype = IVar4.itype;
  IntVect::IntVect(&local_38,iVar10,iVar9,local_2d8.vect[2] - local_64.vect[2]);
  IVar4.itype = local_2c8.btype.itype;
  local_50 = local_38.vect[2];
  local_58[0] = local_38.vect[0];
  local_58[1] = local_38.vect[1];
  local_100 = local_38.vect[2];
  local_108[0] = local_38.vect[0];
  local_108[1] = local_38.vect[1];
  local_dc = local_38.vect[0];
  iStack_d8 = local_38.vect[1];
  uVar1 = _local_dc;
  local_d4 = local_38.vect[2];
  local_b8 = &local_2c8.bigend;
  local_c0 = &local_dc;
  local_8c = 0;
  local_dc = local_38.vect[0];
  local_2c8.bigend.vect[0] = local_dc + local_2c8.bigend.vect[0];
  local_9c = 1;
  iStack_d8 = local_38.vect[1];
  local_2c8.bigend.vect[1] = iStack_d8 + local_2c8.bigend.vect[1];
  local_ac = 2;
  local_2c8.bigend.vect[2] = local_38.vect[2] + local_2c8._20_8_;
  _local_dc = uVar1;
  local_a8 = local_c0;
  local_98 = local_c0;
  local_88 = local_c0;
  uVar1 = local_2c8._20_8_;
  local_2c8.btype.itype = IVar4.itype;
  IndexType::IndexType(&local_10c,local_d0);
  local_2c8.btype.itype = local_10c.itype;
  IVar4.itype = local_2c8.btype.itype;
  local_2a0 = &local_2c8;
  local_304.smallend.vect[0] = local_2c8.smallend.vect[0];
  local_304.smallend.vect[1] = local_2c8.smallend.vect[1];
  local_304.bigend.vect[0] = local_2c8.bigend.vect[0];
  local_304.smallend.vect[2] = local_2c8.smallend.vect[2];
  local_304.bigend.vect[2] = local_2c8.bigend.vect[2];
  local_304.btype.itype = local_2c8.btype.itype;
  local_304.bigend.vect[1] = local_2c8.bigend.vect[1];
  for (local_308 = 0; local_2c8.btype.itype = IVar4.itype, IVar4.itype = local_2c8.btype.itype,
      local_2c8.btype.itype = IVar4.itype, local_308 < 3; local_308 = local_308 + 1) {
    uVar1 = local_2c8._20_8_;
    bVar5 = Geometry::isPeriodic(local_268,local_308);
    IVar4.itype = local_2c8.btype.itype;
    if (bVar5) {
      local_238 = local_278;
      local_23c = local_308;
      uVar1 = local_2c8._20_8_;
      local_2c8.btype.itype = IVar4.itype;
      Box::grow(&local_304,local_308,*(int *)((long)local_278 + (long)local_308 * 4));
      IVar4.itype = local_2c8.btype.itype;
    }
    local_2c8.btype.itype = IVar4.itype;
    IVar4.itype = local_2c8.btype.itype;
  }
  uVar1 = local_2c8._20_8_;
  bVar5 = Box::contains(&local_304,local_250);
  IVar4.itype = local_2c8.btype.itype;
  if (!bVar5) {
    local_230 = local_258;
    local_1e0 = *(double **)(local_258 + 0x10);
    local_1e8 = (undefined8 *)(local_258 + 0x18);
    local_1ec = *(int *)(local_258 + 0x34);
    local_194 = 0;
    local_1c0 = *(undefined4 *)local_1e8;
    local_1a4 = 1;
    uStack_1bc = *(undefined4 *)(local_258 + 0x1c);
    local_208._0_8_ = *local_1e8;
    local_1b4 = 2;
    local_208.z = *(int *)(local_258 + 0x20);
    local_140 = (int *)(local_258 + 0x24);
    local_144 = 0;
    local_170 = *local_140 + 1;
    local_150 = local_258 + 0x24;
    local_154 = 1;
    iStack_16c = *(int *)(local_258 + 0x28) + 1;
    local_160 = local_258 + 0x24;
    local_164 = 2;
    local_228.z = *(int *)(local_258 + 0x2c) + 1;
    local_228.y = iStack_16c;
    local_228.x = local_170;
    local_214._0_8_ = local_228._0_8_;
    local_214.z = local_228.z;
    local_1f8._0_8_ = local_208._0_8_;
    local_1f8.z = local_208.z;
    local_1d8._0_8_ = local_208._0_8_;
    local_1d8.z = local_208.z;
    local_1c8 = local_1e8;
    local_1b8 = local_208.z;
    local_1b0 = local_1e8;
    local_1a0 = local_1e8;
    local_190 = local_1e8;
    local_188._0_8_ = local_228._0_8_;
    local_188.z = local_228.z;
    local_178 = local_1e8;
    local_168 = local_228.z;
    uVar1 = local_2c8._20_8_;
    local_2c8.btype.itype = IVar4.itype;
    Array4<double>::Array4(&local_350,local_1e0,&local_1f8,&local_214,local_1ec);
    uVar1 = local_2c8._20_8_;
    local_310 = &local_350;
    IVar4.itype = local_2c8.btype.itype;
    local_2c8._20_8_ = uVar1;
    uVar1 = local_2c8._20_8_;
    local_2c8.btype.itype = IVar4.itype;
    Geometry::data(in_RDI);
    uVar1 = local_2c8._20_8_;
    IVar4.itype = local_2c8.btype.itype;
    local_2c8._20_8_ = uVar1;
    uVar1 = local_2c8._20_8_;
    local_2c8.btype.itype = IVar4.itype;
    std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
              ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x3649e8);
    uVar1 = local_2c8._20_8_;
    IVar4.itype = local_2c8.btype.itype;
    local_2c8._20_8_ = uVar1;
    uVar1 = local_2c8._20_8_;
    local_2c8.btype.itype = IVar4.itype;
    Gpu::AsyncArray<amrex::BCRec,_0>::AsyncArray
              ((AsyncArray<amrex::BCRec,_0> *)in_RDI,
               (BCRec *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510));
    uVar1 = local_2c8._20_8_;
    IVar4.itype = local_2c8.btype.itype;
    local_2c8._20_8_ = uVar1;
    uVar1 = local_2c8._20_8_;
    local_2c8.btype.itype = IVar4.itype;
    local_3e0 = Gpu::AsyncArray<amrex::BCRec,_0>::data(&local_3d8);
    uVar1 = local_2c8._20_8_;
    local_400 = *(undefined8 *)&in_RDI->super_CoordSys;
    local_3f8 = (in_RDI->super_CoordSys).offset[0];
    local_3f0 = (in_RDI->super_CoordSys).offset[1];
    local_3e8 = (in_RDI->super_CoordSys).offset[2];
    IVar4.itype = local_2c8.btype.itype;
    local_2c8._20_8_ = uVar1;
    uVar1 = local_2c8._20_8_;
    local_2c8.btype.itype = IVar4.itype;
    bVar5 = Geometry::isPeriodic(local_268,0);
    uVar1 = local_2c8._20_8_;
    if (!bVar5) {
      IVar4.itype = local_2c8.btype.itype;
      local_2c8._20_8_ = uVar1;
      uVar1 = local_2c8._20_8_;
      local_2c8.btype.itype = IVar4.itype;
      iVar9 = Box::smallEnd(local_250,0);
      uVar1 = local_2c8._20_8_;
      IVar4.itype = local_2c8.btype.itype;
      local_2c8._20_8_ = uVar1;
      uVar1 = local_2c8._20_8_;
      local_2c8.btype.itype = IVar4.itype;
      iVar10 = Box::smallEnd(local_2a0,0);
      uVar1 = local_2c8._20_8_;
      if (iVar9 < iVar10) {
        local_41c.smallend.vect._0_8_ = *(undefined8 *)(local_250->smallend).vect;
        local_41c._8_8_ = *(undefined8 *)((local_250->smallend).vect + 2);
        local_41c.bigend.vect._4_8_ = *(undefined8 *)((local_250->bigend).vect + 1);
        local_41c.btype.itype = (local_250->btype).itype;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        local_420 = Box::smallEnd(local_2a0,0);
        uVar1 = local_2c8._20_8_;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        Box::setBig(&local_41c,0,local_420 + -1);
        uVar1 = local_2c8._20_8_;
        local_520 = local_25c;
        local_51c = local_260;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        memcpy(auStack_518,local_310,0x3c);
        uVar1 = local_2c8._20_8_;
        local_4d8 = local_420;
        local_4d0 = local_400;
        local_4c8 = local_3f8;
        local_4c0 = local_3f0;
        local_4b8 = local_3e8._0_4_;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        memcpy(auStack_4b0,local_3c8,0x78);
        uVar1 = local_2c8._20_8_;
        local_438 = local_270;
        local_430 = local_3e0;
        local_428 = in_stack_00000018;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_1_>
                  (in_stack_fffffffffffff560,(anon_class_256_9_c1a331ff *)in_stack_fffffffffffff558)
        ;
        uVar1 = local_2c8._20_8_;
      }
    }
    local_2c8._20_8_ = uVar1;
    IVar4.itype = local_2c8.btype.itype;
    uVar1 = local_2c8._20_8_;
    local_2c8.btype.itype = IVar4.itype;
    bVar5 = Geometry::isPeriodic(local_268,0);
    uVar1 = local_2c8._20_8_;
    if (!bVar5) {
      IVar4.itype = local_2c8.btype.itype;
      local_2c8._20_8_ = uVar1;
      uVar1 = local_2c8._20_8_;
      local_2c8.btype.itype = IVar4.itype;
      iVar9 = Box::bigEnd(local_250,0);
      uVar1 = local_2c8._20_8_;
      IVar4.itype = local_2c8.btype.itype;
      local_2c8._20_8_ = uVar1;
      uVar1 = local_2c8._20_8_;
      local_2c8.btype.itype = IVar4.itype;
      iVar10 = Box::bigEnd(local_2a0,0);
      uVar1 = local_2c8._20_8_;
      if (iVar10 < iVar9) {
        local_53c.smallend.vect._0_8_ = *(undefined8 *)(local_250->smallend).vect;
        local_53c._8_8_ = *(undefined8 *)((local_250->smallend).vect + 2);
        local_53c.bigend.vect._4_8_ = *(undefined8 *)((local_250->bigend).vect + 1);
        local_53c.btype.itype = (local_250->btype).itype;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        local_540 = Box::bigEnd(local_2a0,0);
        uVar1 = local_2c8._20_8_;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        Box::setSmall(&local_53c,0,local_540 + 1);
        uVar1 = local_2c8._20_8_;
        local_640 = local_25c;
        local_63c = local_260;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        memcpy(auStack_638,local_310,0x3c);
        uVar1 = local_2c8._20_8_;
        local_5f8 = local_540;
        local_5f0 = local_400;
        local_5e8 = local_3f8;
        local_5e0 = local_3f0;
        local_5d8 = local_3e8._0_4_;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        memcpy(auStack_5d0,local_3c8,0x78);
        uVar1 = local_2c8._20_8_;
        local_558 = local_270;
        local_550 = local_3e0;
        local_548 = in_stack_00000018;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_2_>
                  (in_stack_fffffffffffff560,in_stack_fffffffffffff558);
        uVar1 = local_2c8._20_8_;
      }
    }
    local_2c8._20_8_ = uVar1;
    IVar4.itype = local_2c8.btype.itype;
    uVar1 = local_2c8._20_8_;
    local_2c8.btype.itype = IVar4.itype;
    bVar5 = Geometry::isPeriodic(local_268,1);
    uVar1 = local_2c8._20_8_;
    if (!bVar5) {
      IVar4.itype = local_2c8.btype.itype;
      local_2c8._20_8_ = uVar1;
      uVar1 = local_2c8._20_8_;
      local_2c8.btype.itype = IVar4.itype;
      iVar9 = Box::smallEnd(local_250,1);
      uVar1 = local_2c8._20_8_;
      IVar4.itype = local_2c8.btype.itype;
      local_2c8._20_8_ = uVar1;
      uVar1 = local_2c8._20_8_;
      local_2c8.btype.itype = IVar4.itype;
      iVar10 = Box::smallEnd(local_2a0,1);
      uVar1 = local_2c8._20_8_;
      if (iVar9 < iVar10) {
        local_65c.smallend.vect._0_8_ = *(undefined8 *)(local_250->smallend).vect;
        local_65c._8_8_ = *(undefined8 *)((local_250->smallend).vect + 2);
        local_65c.bigend.vect._4_8_ = *(undefined8 *)((local_250->bigend).vect + 1);
        local_65c.btype.itype = (local_250->btype).itype;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        local_660 = Box::smallEnd(local_2a0,1);
        uVar1 = local_2c8._20_8_;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        Box::setBig(&local_65c,1,local_660 + -1);
        uVar1 = local_2c8._20_8_;
        local_760 = local_25c;
        local_75c = local_260;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        memcpy(auStack_758,local_310,0x3c);
        uVar1 = local_2c8._20_8_;
        local_718 = local_660;
        local_710 = local_400;
        local_708 = local_3f8;
        local_700 = local_3f0;
        local_6f8 = local_3e8._0_4_;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        memcpy(auStack_6f0,local_3c8,0x78);
        uVar1 = local_2c8._20_8_;
        local_678 = local_270;
        local_670 = local_3e0;
        local_668 = in_stack_00000018;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_3_>
                  (in_stack_fffffffffffff560,(anon_class_256_9_29845ede *)in_stack_fffffffffffff558)
        ;
        uVar1 = local_2c8._20_8_;
      }
    }
    local_2c8._20_8_ = uVar1;
    IVar4.itype = local_2c8.btype.itype;
    uVar1 = local_2c8._20_8_;
    local_2c8.btype.itype = IVar4.itype;
    bVar5 = Geometry::isPeriodic(local_268,1);
    uVar1 = local_2c8._20_8_;
    if (!bVar5) {
      IVar4.itype = local_2c8.btype.itype;
      local_2c8._20_8_ = uVar1;
      uVar1 = local_2c8._20_8_;
      local_2c8.btype.itype = IVar4.itype;
      iVar9 = Box::bigEnd(local_250,1);
      uVar1 = local_2c8._20_8_;
      IVar4.itype = local_2c8.btype.itype;
      local_2c8._20_8_ = uVar1;
      uVar1 = local_2c8._20_8_;
      local_2c8.btype.itype = IVar4.itype;
      iVar10 = Box::bigEnd(local_2a0,1);
      uVar1 = local_2c8._20_8_;
      if (iVar10 < iVar9) {
        local_77c.smallend.vect._0_8_ = *(undefined8 *)(local_250->smallend).vect;
        local_77c._8_8_ = *(undefined8 *)((local_250->smallend).vect + 2);
        local_77c.bigend.vect._4_8_ = *(undefined8 *)((local_250->bigend).vect + 1);
        local_77c.btype.itype = (local_250->btype).itype;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        local_780 = Box::bigEnd(local_2a0,1);
        uVar1 = local_2c8._20_8_;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        Box::setSmall(&local_77c,1,local_780 + 1);
        uVar1 = local_2c8._20_8_;
        local_880 = local_25c;
        local_87c = local_260;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        memcpy(auStack_878,local_310,0x3c);
        uVar1 = local_2c8._20_8_;
        local_838 = local_780;
        local_830 = local_400;
        local_828 = local_3f8;
        local_820 = local_3f0;
        local_818 = local_3e8._0_4_;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        memcpy(auStack_810,local_3c8,0x78);
        uVar1 = local_2c8._20_8_;
        local_798 = local_270;
        local_790 = local_3e0;
        local_788 = in_stack_00000018;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_4_>
                  (in_stack_fffffffffffff560,(anon_class_256_9_4bae5e20 *)in_stack_fffffffffffff558)
        ;
        uVar1 = local_2c8._20_8_;
      }
    }
    local_2c8._20_8_ = uVar1;
    IVar4.itype = local_2c8.btype.itype;
    uVar1 = local_2c8._20_8_;
    local_2c8.btype.itype = IVar4.itype;
    bVar5 = Geometry::isPeriodic(local_268,2);
    uVar1 = local_2c8._20_8_;
    if (!bVar5) {
      IVar4.itype = local_2c8.btype.itype;
      local_2c8._20_8_ = uVar1;
      uVar1 = local_2c8._20_8_;
      local_2c8.btype.itype = IVar4.itype;
      iVar9 = Box::smallEnd(local_250,2);
      uVar1 = local_2c8._20_8_;
      IVar4.itype = local_2c8.btype.itype;
      local_2c8._20_8_ = uVar1;
      uVar1 = local_2c8._20_8_;
      local_2c8.btype.itype = IVar4.itype;
      iVar10 = Box::smallEnd(local_2a0,2);
      uVar1 = local_2c8._20_8_;
      if (iVar9 < iVar10) {
        local_89c.smallend.vect._0_8_ = *(undefined8 *)(local_250->smallend).vect;
        local_89c._8_8_ = *(undefined8 *)((local_250->smallend).vect + 2);
        local_89c.bigend.vect._4_8_ = *(undefined8 *)((local_250->bigend).vect + 1);
        local_89c.btype.itype = (local_250->btype).itype;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        local_8a0 = Box::smallEnd(local_2a0,2);
        uVar1 = local_2c8._20_8_;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        Box::setBig(&local_89c,2,local_8a0 + -1);
        uVar1 = local_2c8._20_8_;
        local_9a0 = local_25c;
        local_99c = local_260;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        memcpy(auStack_998,local_310,0x3c);
        uVar1 = local_2c8._20_8_;
        local_958 = local_8a0;
        local_950 = local_400;
        local_948 = local_3f8;
        local_940 = local_3f0;
        local_938 = local_3e8._0_4_;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        memcpy(auStack_930,local_3c8,0x78);
        uVar1 = local_2c8._20_8_;
        local_8b8 = local_270;
        local_8b0 = local_3e0;
        local_8a8 = in_stack_00000018;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_5_>
                  (in_stack_fffffffffffff560,(anon_class_256_9_91658bbd *)in_stack_fffffffffffff558)
        ;
        uVar1 = local_2c8._20_8_;
      }
    }
    local_2c8._20_8_ = uVar1;
    IVar4.itype = local_2c8.btype.itype;
    uVar1 = local_2c8._20_8_;
    local_2c8.btype.itype = IVar4.itype;
    bVar5 = Geometry::isPeriodic(local_268,2);
    uVar1 = local_2c8._20_8_;
    if (!bVar5) {
      IVar4.itype = local_2c8.btype.itype;
      local_2c8._20_8_ = uVar1;
      uVar1 = local_2c8._20_8_;
      local_2c8.btype.itype = IVar4.itype;
      iVar9 = Box::bigEnd(local_250,2);
      uVar1 = local_2c8._20_8_;
      IVar4.itype = local_2c8.btype.itype;
      local_2c8._20_8_ = uVar1;
      uVar1 = local_2c8._20_8_;
      local_2c8.btype.itype = IVar4.itype;
      iVar10 = Box::bigEnd(local_2a0,2);
      uVar1 = local_2c8._20_8_;
      if (iVar10 < iVar9) {
        local_9bc.smallend.vect._0_8_ = *(undefined8 *)(local_250->smallend).vect;
        local_9bc._8_8_ = *(undefined8 *)((local_250->smallend).vect + 2);
        local_9bc.bigend.vect._4_8_ = *(undefined8 *)((local_250->bigend).vect + 1);
        local_9bc.btype.itype = (local_250->btype).itype;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        local_9c0 = Box::bigEnd(local_2a0,2);
        uVar1 = local_2c8._20_8_;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        Box::setSmall(&local_9bc,2,local_9c0 + 1);
        uVar1 = local_2c8._20_8_;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        memcpy(auStack_ab8,local_310,0x3c);
        uVar1 = local_2c8._20_8_;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        memcpy(auStack_a50,local_3c8,0x78);
        uVar1 = local_2c8._20_8_;
        local_9d8 = local_270;
        local_9d0 = local_3e0;
        local_9c8 = in_stack_00000018;
        IVar4.itype = local_2c8.btype.itype;
        local_2c8._20_8_ = uVar1;
        uVar1 = local_2c8._20_8_;
        local_2c8.btype.itype = IVar4.itype;
        ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_6_>
                  (in_stack_fffffffffffff560,(anon_class_256_9_b38f8aff *)in_stack_fffffffffffff558)
        ;
        uVar1 = local_2c8._20_8_;
      }
    }
    local_2c8._20_8_ = uVar1;
    IVar4.itype = local_2c8.btype.itype;
    uVar1 = local_2c8._20_8_;
    local_2c8.btype.itype = IVar4.itype;
    Gpu::AsyncArray<amrex::BCRec,_0>::~AsyncArray((AsyncArray<amrex::BCRec,_0> *)0x36540b);
  }
  return;
}

Assistant:

void
GpuBndryFuncFab<F>::nddoit (Box const& bx, FArrayBox& dest,
                            const int dcomp, const int numcomp,
                            Geometry const& geom, const Real time,
                            const Vector<BCRec>& bcr, const int bcomp,
                            const int orig_comp)
{
    const IntVect& len = bx.length();

    Box const& domain = amrex::convert(geom.Domain(),IntVect::TheNodeVector());
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            gdomain.grow(idim,len[idim]);
        }
    }

    if (gdomain.contains(bx)) return;

    Array4<Real> const& fab = dest.array();
    const auto geomdata = geom.data();

    AsyncArray<BCRec> bcr_aa(bcr.data()+bcomp, numcomp);
    BCRec* bcr_p = bcr_aa.data();

    const auto f_user = m_user_f;

    // xlo
    if (!geom.isPeriodic(0) && bx.smallEnd(0) < domain.smallEnd(0)) {
        Box bndry = bx;
        int dxlo = domain.smallEnd(0);
        bndry.setBig(0,dxlo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(dxlo,j,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // xhi
    if (!geom.isPeriodic(0) && bx.bigEnd(0) > domain.bigEnd(0)) {
        Box bndry = bx;
        int dxhi = domain.bigEnd(0);
        bndry.setSmall(0,dxhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(dxhi,j,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

#if (AMREX_SPACEDIM >= 2)
    // ylo
    if (!geom.isPeriodic(1) && bx.smallEnd(1) < domain.smallEnd(1)) {
        Box bndry = bx;
        int dylo = domain.smallEnd(1);
        bndry.setBig(1,dylo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,dylo,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // yhi
    if (!geom.isPeriodic(1) && bx.bigEnd(1) > domain.bigEnd(1)) {
        Box bndry = bx;
        int dyhi = domain.bigEnd(1);
        bndry.setSmall(1,dyhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,dyhi,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // zlo
    if (!geom.isPeriodic(2) && bx.smallEnd(2) < domain.smallEnd(2)) {
        Box bndry = bx;
        int dzlo = domain.smallEnd(2);
        bndry.setBig(2,dzlo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,j,dzlo,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // zhi
    if (!geom.isPeriodic(2) && bx.bigEnd(2) > domain.bigEnd(2)) {
        Box bndry = bx;
        int dzhi = domain.bigEnd(2);
        bndry.setSmall(2,dzhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,j,dzhi,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }
#endif
}